

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

bool __thiscall
dtc::text_input_buffer::consume_integer_expression
          (text_input_buffer *this,unsigned_long_long *outInt)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  type peVar4;
  undefined4 extraout_var;
  byte extraout_DL;
  result r;
  undefined1 local_28 [8];
  expression_ptr e;
  unsigned_long_long *outInt_local;
  text_input_buffer *this_local;
  
  e._M_t.
  super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl =
       (__uniq_ptr_data<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>,_true,_true>
        )(__uniq_ptr_data<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>,_true,_true>
          )outInt;
  cVar1 = operator*(this);
  if (cVar1 == 0x28) {
    parse_expression((text_input_buffer *)local_28,SUB81(this,0));
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_28);
    if (bVar2) {
      peVar4 = std::
               unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
               ::operator*((unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                            *)local_28);
      iVar3 = (**peVar4->_vptr_expression)();
      if ((extraout_DL & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        *(ulong *)e._M_t.
                  super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                  .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>.
                  _M_head_impl = CONCAT44(extraout_var,iVar3);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    std::
    unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
    ::~unique_ptr((unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                   *)local_28);
  }
  else if ((int)cVar1 - 0x30U < 10) {
    this_local._7_1_ =
         consume_integer(this,(unsigned_long_long *)
                              e._M_t.
                              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                              .
                              super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>
                              ._M_head_impl);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
text_input_buffer::consume_integer_expression(unsigned long long &outInt)
{
	switch (*(*this))
	{
		case '(':
		{
			expression_ptr e(parse_expression(true));
			if (!e)
			{
				return false;
			}
			auto r = (*e)();
			if (r.second)
			{
				outInt = r.first;
				return true;
			}
			return false;
		}
		case '0'...'9':
			return consume_integer(outInt);
		default:
			return false;
	}
}